

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

char * __thiscall cmTarget::GetProperty(cmTarget *this,string *prop)

{
  char cVar1;
  size_t __n;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  const_iterator cVar6;
  string *psVar7;
  char *pcVar8;
  cmState *this_00;
  long *plVar9;
  long lVar10;
  undefined1 local_21a;
  undefined1 local_219;
  cmStateSnapshot local_218;
  undefined1 local_200 [32];
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  long *local_40 [2];
  long local_30 [2];
  
  if ((GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propLINK_LIBRARIES_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_,
               "LINK_LIBRARIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_),
     iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_,"TYPE","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propINCLUDE_DIRECTORIES_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_.
                   field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_,
               "INCLUDE_DIRECTORIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                         propINCLUDE_DIRECTORIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propCOMPILE_FEATURES_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_.field_2
    ;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_,
               "COMPILE_FEATURES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propCOMPILE_OPTIONS_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_,
               "COMPILE_OPTIONS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propCOMPILE_DEFINITIONS_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_.
                   field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_,
               "COMPILE_DEFINITIONS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                         propCOMPILE_DEFINITIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propLINK_OPTIONS_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_,
               "LINK_OPTIONS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propLINK_DIRECTORIES_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_.field_2
    ;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_,
               "LINK_DIRECTORIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_
                                 ), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_,
               "IMPORTED","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propIMPORTED_GLOBAL_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_,
               "IMPORTED_GLOBAL","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                      propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_._M_dataplus
    ._M_p = (pointer)&GetProperty(std::__cxx11::string_const&)::
                      propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_
               ,"MANUALLY_ADDED_DEPENDENCIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::
                  propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                         propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_),
     iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_,"NAME","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propBINARY_DIR_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_,
               "BINARY_DIR","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propSOURCE_DIR_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_,
               "SOURCE_DIR","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_)
     , iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_,"SOURCES"
               ,"");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                                 ), iVar5 != 0)) {
    local_200._0_8_ = local_200 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_200,
               GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_._M_dataplus.
               _M_p,GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_.
                    _M_dataplus._M_p +
                    GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_.
                    _M_string_length);
    local_1e0[0] = local_1d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1e0,
               GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_._M_dataplus._M_p,
               GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_._M_dataplus._M_p +
               GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_._M_string_length);
    local_1c0[0] = local_1b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c0,
               GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_.
               _M_dataplus._M_p,
               GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_.
               _M_dataplus._M_p +
               GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_.
               _M_string_length);
    local_1a0[0] = local_190;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a0,
               GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_._M_dataplus
               ._M_p,GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_.
                     _M_dataplus._M_p +
                     GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_.
                     _M_string_length);
    local_180[0] = local_170;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_180,
               GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_._M_dataplus.
               _M_p,GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_.
                    _M_dataplus._M_p +
                    GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_.
                    _M_string_length);
    local_160[0] = local_150;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_160,
               GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_.
               _M_dataplus._M_p,
               GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_.
               _M_dataplus._M_p +
               GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_.
               _M_string_length);
    local_140[0] = local_130;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_140,
               GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_._M_dataplus.
               _M_p,GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_.
                    _M_dataplus._M_p +
                    GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_.
                    _M_string_length);
    local_120[0] = local_110;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_120,
               GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_._M_dataplus
               ._M_p,GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_.
                     _M_dataplus._M_p +
                     GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_.
                     _M_string_length);
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,
               GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_._M_dataplus._M_p,
               GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_._M_dataplus._M_p +
               GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_._M_string_length);
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e0,
               GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_._M_dataplus.
               _M_p,GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_.
                    _M_dataplus._M_p +
                    GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_.
                    _M_string_length);
    local_c0[0] = local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c0,
               GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_.
               _M_dataplus._M_p,
               GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_.
               _M_dataplus._M_p +
               GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_.
               _M_string_length);
    local_a0[0] = local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,
               GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_._M_dataplus._M_p,
               GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_._M_dataplus._M_p +
               GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_._M_string_length);
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,
               GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_._M_dataplus._M_p,
               GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_._M_dataplus._M_p
               + GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_.
                 _M_string_length);
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,
               GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_._M_dataplus._M_p,
               GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_._M_dataplus._M_p
               + GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_.
                 _M_string_length);
    plVar9 = local_30;
    local_40[0] = plVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,
               GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_._M_dataplus._M_p,
               GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_._M_dataplus._M_p +
               GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_._M_string_length);
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::__cxx11::string_const*>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,local_200,
               &stack0xffffffffffffffe0,0,&local_218,&local_219,&local_21a);
    lVar10 = -0x1e0;
    do {
      if (plVar9 != (long *)plVar9[-2]) {
        operator_delete((long *)plVar9[-2],*plVar9 + 1);
      }
      plVar9 = plVar9 + -4;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_);
  }
  cVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_._M_h,prop);
  if (cVar6.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
LAB_00211480:
    pcVar8 = cmPropertyMap::GetPropertyValue
                       (&((this->impl)._M_t.
                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                          .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                         Properties,prop);
    if (pcVar8 == (char *)0x0) {
      this_00 = cmMakefile::GetState
                          (((this->impl)._M_t.
                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                            .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                           Makefile);
      pcVar8 = (pointer)0x0;
      bVar4 = cmState::IsPropertyChained(this_00,prop,TARGET);
      if (bVar4) {
        cmMakefile::GetStateSnapshot
                  (((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_200,&local_218);
        pcVar8 = cmStateDirectory::GetProperty((cmStateDirectory *)local_200,prop,true);
      }
    }
  }
  else {
    __n = prop->_M_string_length;
    if ((__n == GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_.
                _M_string_length) &&
       ((__n == 0 ||
        (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                      GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_.
                      _M_dataplus._M_p,__n), iVar5 == 0)))) {
      _Var2._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      if (*(pointer *)
           &((_Var2._M_head_impl)->LinkImplementationPropertyEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          != *(pointer *)((long)&(_Var2._M_head_impl)->LinkImplementationPropertyEntries + 8)) {
        if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
          GetProperty();
        }
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((string *)local_200,
                   &((this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                    LinkImplementationPropertyEntries,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)local_200);
        if ((undefined1 *)local_200._0_8_ == local_200 + 0x10) {
          return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
        }
        operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
        return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
      }
    }
    else {
      if ((__n == GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_._M_string_length) &&
         ((__n == 0 ||
          (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                        GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_._M_dataplus.
                        _M_p,__n), iVar5 == 0)))) {
        pcVar8 = cmState::GetTargetTypeName
                           (((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            TargetType);
        return pcVar8;
      }
      if ((__n == GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_.
                  _M_string_length) &&
         ((__n == 0 ||
          (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                        GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_
                        ._M_dataplus._M_p,__n), iVar5 == 0)))) {
        _Var2._M_head_impl =
             (this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
        if (*(pointer *)
             &((_Var2._M_head_impl)->IncludeDirectoriesEntries).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            != *(pointer *)((long)&(_Var2._M_head_impl)->IncludeDirectoriesEntries + 8)) {
          if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
            GetProperty();
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_200,
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      IncludeDirectoriesEntries,";");
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                     (string *)local_200);
          if ((undefined1 *)local_200._0_8_ == local_200 + 0x10) {
            return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
          }
          operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
          return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
        }
      }
      else if ((__n == GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_.
                       _M_string_length) &&
              ((__n == 0 ||
               (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                             GetProperty(std::__cxx11::string_const&)::
                             propCOMPILE_FEATURES_abi_cxx11_._M_dataplus._M_p,__n), iVar5 == 0)))) {
        _Var2._M_head_impl =
             (this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
        if (*(pointer *)
             &((_Var2._M_head_impl)->CompileFeaturesEntries).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            != *(pointer *)((long)&(_Var2._M_head_impl)->CompileFeaturesEntries + 8)) {
          if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
            GetProperty();
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_200,
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      CompileFeaturesEntries,";");
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                     (string *)local_200);
          if ((undefined1 *)local_200._0_8_ == local_200 + 0x10) {
            return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
          }
          operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
          return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
        }
      }
      else if ((__n == GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_.
                       _M_string_length) &&
              ((__n == 0 ||
               (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                             GetProperty(std::__cxx11::string_const&)::
                             propCOMPILE_OPTIONS_abi_cxx11_._M_dataplus._M_p,__n), iVar5 == 0)))) {
        _Var2._M_head_impl =
             (this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
        if (*(pointer *)
             &((_Var2._M_head_impl)->CompileOptionsEntries).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            != *(pointer *)((long)&(_Var2._M_head_impl)->CompileOptionsEntries + 8)) {
          if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
            GetProperty();
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_200,
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      CompileOptionsEntries,";");
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                     (string *)local_200);
          if ((undefined1 *)local_200._0_8_ == local_200 + 0x10) {
            return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
          }
          operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
          return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
        }
      }
      else {
        _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                      propCOMPILE_DEFINITIONS_abi_cxx11_);
        if (_Var3) {
          _Var2._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          if (*(pointer *)
               &((_Var2._M_head_impl)->CompileDefinitionsEntries).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              != *(pointer *)((long)&(_Var2._M_head_impl)->CompileDefinitionsEntries + 8)) {
            if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
              GetProperty();
            }
            cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((string *)local_200,
                       &((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                        CompileDefinitionsEntries,";");
            std::__cxx11::string::operator=
                      ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                       (string *)local_200);
            if ((undefined1 *)local_200._0_8_ == local_200 + 0x10) {
              return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
            }
            operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
            return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
          }
        }
        else {
          _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                        propLINK_OPTIONS_abi_cxx11_);
          if (_Var3) {
            _Var2._M_head_impl =
                 (this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
            if (*(pointer *)
                 &((_Var2._M_head_impl)->LinkOptionsEntries).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                != *(pointer *)((long)&(_Var2._M_head_impl)->LinkOptionsEntries + 8)) {
              if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
                GetProperty();
              }
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((string *)local_200,
                         &((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          LinkOptionsEntries,";");
              std::__cxx11::string::operator=
                        ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                         (string *)local_200);
              if ((undefined1 *)local_200._0_8_ == local_200 + 0x10) {
                return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
              }
              operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
              return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
            }
          }
          else {
            _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                          propLINK_DIRECTORIES_abi_cxx11_);
            if (_Var3) {
              _Var2._M_head_impl =
                   (this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
              if (*(pointer *)
                   &((_Var2._M_head_impl)->LinkDirectoriesEntries).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  != *(pointer *)((long)&(_Var2._M_head_impl)->LinkDirectoriesEntries + 8)) {
                if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
                  GetProperty();
                }
                cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((string *)local_200,
                           &((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            LinkDirectoriesEntries,";");
                std::__cxx11::string::operator=
                          ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                           (string *)local_200);
                if ((undefined1 *)local_200._0_8_ == local_200 + 0x10) {
                  return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus.
                         _M_p;
                }
                operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
                return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
              }
            }
            else {
              _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                            propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
              if (!_Var3) {
                _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                              propIMPORTED_abi_cxx11_);
                if (_Var3) {
                  cVar1 = ((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          IsImportedTarget;
LAB_002113d3:
                  if (cVar1 == '\0') {
                    return "FALSE";
                  }
                  return "TRUE";
                }
                _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                              propIMPORTED_GLOBAL_abi_cxx11_);
                if (_Var3) {
                  cVar1 = ((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          ImportedGloballyVisible;
                  goto LAB_002113d3;
                }
                _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                              propNAME_abi_cxx11_);
                if (_Var3) {
                  return (((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Name).
                         _M_dataplus._M_p;
                }
                _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                              propBINARY_DIR_abi_cxx11_);
                if (_Var3) {
                  cmMakefile::GetStateSnapshot
                            (((this->impl)._M_t.
                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                              .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                             Makefile);
                  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_200,&local_218);
                  psVar7 = cmStateDirectory::GetCurrentBinary_abi_cxx11_
                                     ((cmStateDirectory *)local_200);
LAB_0021147b:
                  return (psVar7->_M_dataplus)._M_p;
                }
                _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                              propSOURCE_DIR_abi_cxx11_);
                if (_Var3) {
                  cmMakefile::GetStateSnapshot
                            (((this->impl)._M_t.
                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                              .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                             Makefile);
                  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_200,&local_218);
                  psVar7 = cmStateDirectory::GetCurrentSource_abi_cxx11_
                                     ((cmStateDirectory *)local_200);
                  goto LAB_0021147b;
                }
                goto LAB_00211480;
              }
              if (*(size_t *)
                   ((long)&((this->impl)._M_t.
                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                            .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                           Utilities + 0x28) != 0) {
                if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
                  GetProperty();
                }
                cmJoin<std::set<BT<std::__cxx11::string>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>>
                          ((string *)local_200,
                           &((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            Utilities,";");
                std::__cxx11::string::operator=
                          ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                           (string *)local_200);
                if ((undefined1 *)local_200._0_8_ == local_200 + 0x10) {
                  return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus.
                         _M_p;
                }
                operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
                return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
              }
            }
          }
        }
      }
    }
    pcVar8 = (pointer)0x0;
  }
  return pcVar8;
}

Assistant:

const char* cmTarget::GetProperty(const std::string& prop) const
{
#define MAKE_STATIC_PROP(PROP) static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(TYPE);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(LINK_OPTIONS);
  MAKE_STATIC_PROP(LINK_DIRECTORIES);
  MAKE_STATIC_PROP(IMPORTED);
  MAKE_STATIC_PROP(IMPORTED_GLOBAL);
  MAKE_STATIC_PROP(MANUALLY_ADDED_DEPENDENCIES);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(BINARY_DIR);
  MAKE_STATIC_PROP(SOURCE_DIR);
  MAKE_STATIC_PROP(SOURCES);
#undef MAKE_STATIC_PROP
  static std::unordered_set<std::string> const specialProps{
    propLINK_LIBRARIES,
    propTYPE,
    propINCLUDE_DIRECTORIES,
    propCOMPILE_FEATURES,
    propCOMPILE_OPTIONS,
    propCOMPILE_DEFINITIONS,
    propLINK_OPTIONS,
    propLINK_DIRECTORIES,
    propIMPORTED,
    propIMPORTED_GLOBAL,
    propMANUALLY_ADDED_DEPENDENCIES,
    propNAME,
    propBINARY_DIR,
    propSOURCE_DIR,
    propSOURCES
  };
  if (specialProps.count(prop)) {
    if (prop == propLINK_LIBRARIES) {
      if (impl->LinkImplementationPropertyEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->LinkImplementationPropertyEntries, ";");
      return output.c_str();
    }
    // the type property returns what type the target is
    if (prop == propTYPE) {
      return cmState::GetTargetTypeName(this->GetType());
    }
    if (prop == propINCLUDE_DIRECTORIES) {
      if (impl->IncludeDirectoriesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->IncludeDirectoriesEntries, ";");
      return output.c_str();
    }
    if (prop == propCOMPILE_FEATURES) {
      if (impl->CompileFeaturesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->CompileFeaturesEntries, ";");
      return output.c_str();
    }
    if (prop == propCOMPILE_OPTIONS) {
      if (impl->CompileOptionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->CompileOptionsEntries, ";");
      return output.c_str();
    }
    if (prop == propCOMPILE_DEFINITIONS) {
      if (impl->CompileDefinitionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->CompileDefinitionsEntries, ";");
      return output.c_str();
    }
    if (prop == propLINK_OPTIONS) {
      if (impl->LinkOptionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->LinkOptionsEntries, ";");
      return output.c_str();
    }
    if (prop == propLINK_DIRECTORIES) {
      if (impl->LinkDirectoriesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->LinkDirectoriesEntries, ";");

      return output.c_str();
    }
    if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
      if (impl->Utilities.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(impl->Utilities, ";");
      return output.c_str();
    }
    if (prop == propIMPORTED) {
      return this->IsImported() ? "TRUE" : "FALSE";
    }
    if (prop == propIMPORTED_GLOBAL) {
      return this->IsImportedGloballyVisible() ? "TRUE" : "FALSE";
    }
    if (prop == propNAME) {
      return this->GetName().c_str();
    }
    if (prop == propBINARY_DIR) {
      return impl->Makefile->GetStateSnapshot()
        .GetDirectory()
        .GetCurrentBinary()
        .c_str();
    }
    if (prop == propSOURCE_DIR) {
      return impl->Makefile->GetStateSnapshot()
        .GetDirectory()
        .GetCurrentSource()
        .c_str();
    }
  }

  const char* retVal = impl->Properties.GetPropertyValue(prop);
  if (!retVal) {
    const bool chain =
      impl->Makefile->GetState()->IsPropertyChained(prop, cmProperty::TARGET);
    if (chain) {
      return impl->Makefile->GetStateSnapshot().GetDirectory().GetProperty(
        prop, chain);
    }
  }
  return retVal;
}